

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_8::NameApplier::UseNameForVar(NameApplier *this,string_view name,Var *var)

{
  string_view name_00;
  string_view x;
  bool bVar1;
  string *str;
  string_view local_48;
  NameApplier *local_38;
  char *local_30;
  Var *local_28;
  Var *var_local;
  NameApplier *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (NameApplier *)name.data_;
  local_28 = var;
  var_local = (Var *)this;
  bVar1 = Var::is_name(var);
  if (bVar1) {
    local_38 = this_local;
    local_30 = name_local.data_;
    str = Var::name_abi_cxx11_(local_28);
    string_view::string_view(&local_48,str);
    x.size_ = (size_type)local_30;
    x.data_ = (char *)local_38;
    bVar1 = wabt::operator==(x,local_48);
    if (!bVar1) {
      __assert_fail("name == var->name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/apply-names.cc"
                    ,0x7a,
                    "void wabt::(anonymous namespace)::NameApplier::UseNameForVar(string_view, Var *)"
                   );
    }
  }
  else {
    bVar1 = string_view::empty((string_view *)&this_local);
    if (!bVar1) {
      name_00.size_ = (size_type)name_local.data_;
      name_00.data_ = (char *)this_local;
      Var::set_name(local_28,name_00);
    }
  }
  return;
}

Assistant:

void NameApplier::UseNameForVar(string_view name, Var* var) {
  if (var->is_name()) {
    assert(name == var->name());
    return;
  }

  if (!name.empty()) {
    var->set_name(name);
  }
}